

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gait_plan.c
# Opt level: O0

void Calc_GaitTrajPolyCoeffi_Trot(void)

{
  Matrix_t MVar1;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  Matrix_t TrajectoryPlanningParameterMatrix;
  Matrix_t TrajectoryPlanningMatrix;
  Matrix_t InverseMatrix;
  
  SupportingTime_Trot = sRobot_MotionPara.Cycle * sRobot_MotionPara.DutyRatio;
  SwingTime_Trot = sRobot_MotionPara.Cycle * (1.0 - sRobot_MotionPara.DutyRatio);
  MVar1 = Traj3_Mat(SwingTime_Trot);
  local_48 = MVar1.pMatrix;
  MVar1 = Inv4(MVar1);
  local_58 = MVar1.pMatrix;
  local_50 = MVar1._8_8_;
  MVar1 = Traj3_Para_Mat(sRobot_MotionPara.DutyRatio * -4.0 + 1.0,-4.0,1.0,-4.0);
  local_68 = MVar1.pMatrix;
  local_60 = MVar1._8_8_;
  if (((Coeff_X.pMatrix != (float *)0x0) && (Coeff_Y.pMatrix != (float *)0x0)) &&
     (Coeff_W.pMatrix != (float *)0x0)) {
    free(Coeff_X.pMatrix);
    free(Coeff_Y.pMatrix);
    free(Coeff_W.pMatrix);
  }
  MVar1 = MatrixMultiply(2,local_58,local_50,local_68,local_60);
  local_78 = MVar1.pMatrix;
  Coeff_X.pMatrix = local_78;
  local_70 = MVar1._8_8_;
  Coeff_X.row = (uint8_t)local_70;
  Coeff_X.column = local_70._1_1_;
  Coeff_X._10_6_ = local_70._2_6_;
  MVar1 = MatrixMultiply(2,local_58,local_50,local_68,local_60);
  local_88 = MVar1.pMatrix;
  Coeff_Y.pMatrix = local_88;
  local_80 = MVar1._8_8_;
  Coeff_Y.row = (uint8_t)local_80;
  Coeff_Y.column = local_80._1_1_;
  Coeff_Y._10_6_ = local_80._2_6_;
  MVar1 = MatrixMultiply(2,local_58,local_50,local_68,local_60);
  local_98 = MVar1.pMatrix;
  Coeff_W.pMatrix = local_98;
  local_90 = MVar1._8_8_;
  Coeff_W.row = (uint8_t)local_90;
  Coeff_W.column = local_90._1_1_;
  Coeff_W._10_6_ = local_90._2_6_;
  free(local_48);
  free(local_58);
  free(local_68);
  return;
}

Assistant:

void Calc_GaitTrajPolyCoeffi_Trot(void)
{
	Matrix_t InverseMatrix, TrajectoryPlanningMatrix, TrajectoryPlanningParameterMatrix;

	SupportingTime_Trot = sRobot_MotionPara.Cycle * sRobot_MotionPara.DutyRatio;
	SwingTime_Trot = sRobot_MotionPara.Cycle * (1 - sRobot_MotionPara.DutyRatio);

	TrajectoryPlanningMatrix = Traj3_Mat(SwingTime_Trot);
	InverseMatrix = Inv4(TrajectoryPlanningMatrix);
	TrajectoryPlanningParameterMatrix = Traj3_Para_Mat(1 - 4 * sRobot_MotionPara.DutyRatio, -4, 1, -4);

	if (Coeff_X.pMatrix != NULL && Coeff_Y.pMatrix != NULL && Coeff_W.pMatrix != NULL)
	{
		free(Coeff_X.pMatrix);
		free(Coeff_Y.pMatrix);
		free(Coeff_W.pMatrix);
	}

	Coeff_X = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);
	Coeff_Y = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);
	Coeff_W = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);

	free(TrajectoryPlanningMatrix.pMatrix);
	free(InverseMatrix.pMatrix);
	free(TrajectoryPlanningParameterMatrix.pMatrix);
}